

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O2

ByteMark * __thiscall DataBuffer::addMark(DataBuffer *this,String *name)

{
  ByteMark *pBVar1;
  ByteMark *mark;
  
  pBVar1 = (ByteMark *)operator_new(0x28);
  (pBVar1->name)._string._M_dataplus._M_p = (pointer)&(pBVar1->name)._string.field_2;
  (pBVar1->name)._string._M_string_length = 0;
  (pBVar1->name)._string.field_2._M_local_buf[0] = '\0';
  mark = pBVar1;
  std::__cxx11::string::_M_assign((string *)pBVar1);
  pBVar1->pos = *(int *)&this->m_position - *(int *)&this->m_buffer;
  List<ByteMark_*>::append(&this->m_marks,&mark);
  return mark;
}

Assistant:

ByteMark* DataBuffer::addMark (const String& name)
{
	ByteMark* mark = new ByteMark;
	mark->name = name;
	mark->pos = writtenSize();
	m_marks << mark;
	return mark;
}